

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

char * __thiscall sqvector<char>::push_back(sqvector<char> *this,char *val)

{
  long lVar1;
  long lVar2;
  undefined1 *in_RSI;
  long *in_RDI;
  sqvector<char> *unaff_retaddr;
  
  if ((ulong)in_RDI[2] <= (ulong)in_RDI[1]) {
    _realloc(unaff_retaddr,(SQUnsignedInteger)in_RDI);
  }
  lVar1 = *in_RDI;
  lVar2 = in_RDI[1];
  in_RDI[1] = lVar2 + 1;
  *(undefined1 *)(lVar1 + lVar2) = *in_RSI;
  return (char *)(lVar1 + lVar2);
}

Assistant:

inline T &push_back(const T& val = T())
    {
        if(_allocated <= _size)
            _realloc(_size * 2);
        return *(new ((void *)&_vals[_size++]) T(val));
    }